

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_residual.c
# Opt level: O0

int h264_residual_cabac(bitstream *str,h264_cabac_context *cabac,h264_slice *slice,
                       h264_macroblock *mb,int32_t *block,int cat,int idx,int start,int end,
                       int maxnumcoeff,int coded)

{
  int iVar1;
  int local_270;
  bool local_269;
  uint local_260;
  int local_25c;
  uint32_t s;
  int32_t cam1;
  int numgt1;
  int num1;
  int numcoeff;
  int last;
  uint32_t last_significant_coeff_flag [64];
  uint32_t significant_coeff_flag [64];
  int field;
  uint32_t coded_block_flag;
  int i;
  int cat_local;
  int32_t *block_local;
  h264_macroblock *mb_local;
  h264_slice *slice_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  significant_coeff_flag[0x3f] = 0;
  for (field = 0; field < maxnumcoeff; field = field + 1) {
    if (block[field] != 0) {
      significant_coeff_flag[0x3f] = 1;
    }
  }
  if (coded == 0) {
    iVar1 = vs_infer(str,significant_coeff_flag + 0x3f,0);
    if (iVar1 != 0) {
      return 1;
    }
  }
  else if ((maxnumcoeff == 0x40) && (slice->chroma_array_type != 3)) {
    iVar1 = vs_infer(str,significant_coeff_flag + 0x3f,1);
    if (iVar1 != 0) {
      return 1;
    }
  }
  else {
    iVar1 = h264_coded_block_flag(str,cabac,cat,idx,significant_coeff_flag + 0x3f);
    if (iVar1 != 0) {
      return 1;
    }
  }
  switch(cat) {
  case 0:
    mb->coded_block_flag[0][0x10] = significant_coeff_flag[0x3f];
    break;
  case 1:
  case 2:
    mb->coded_block_flag[0][idx] = significant_coeff_flag[0x3f];
    break;
  case 3:
    mb->coded_block_flag[idx + 1][0x10] = significant_coeff_flag[0x3f];
    break;
  case 4:
    mb->coded_block_flag[(idx >> 3) + 1][(int)(idx & 7)] = significant_coeff_flag[0x3f];
    break;
  case 5:
    mb->coded_block_flag[0][idx << 2] = significant_coeff_flag[0x3f];
    mb->coded_block_flag[0][idx * 4 + 1] = significant_coeff_flag[0x3f];
    mb->coded_block_flag[0][idx * 4 + 2] = significant_coeff_flag[0x3f];
    mb->coded_block_flag[0][idx * 4 + 3] = significant_coeff_flag[0x3f];
    break;
  case 6:
    mb->coded_block_flag[1][0x10] = significant_coeff_flag[0x3f];
    break;
  case 7:
  case 8:
    mb->coded_block_flag[1][idx] = significant_coeff_flag[0x3f];
    break;
  case 9:
    mb->coded_block_flag[1][idx << 2] = significant_coeff_flag[0x3f];
    mb->coded_block_flag[1][idx * 4 + 1] = significant_coeff_flag[0x3f];
    mb->coded_block_flag[1][idx * 4 + 2] = significant_coeff_flag[0x3f];
    mb->coded_block_flag[1][idx * 4 + 3] = significant_coeff_flag[0x3f];
    break;
  case 10:
    mb->coded_block_flag[2][0x10] = significant_coeff_flag[0x3f];
    break;
  case 0xb:
  case 0xc:
    mb->coded_block_flag[2][idx] = significant_coeff_flag[0x3f];
    break;
  case 0xd:
    mb->coded_block_flag[2][idx << 2] = significant_coeff_flag[0x3f];
    mb->coded_block_flag[2][idx * 4 + 1] = significant_coeff_flag[0x3f];
    mb->coded_block_flag[2][idx * 4 + 2] = significant_coeff_flag[0x3f];
    mb->coded_block_flag[2][idx * 4 + 3] = significant_coeff_flag[0x3f];
    break;
  default:
    abort();
  }
  if (significant_coeff_flag[0x3f] == 0) {
    for (field = 0; field < maxnumcoeff; field = field + 1) {
      if (str->dir == VS_ENCODE) {
        if (block[field] != 0) {
          fprintf(_stderr,"Non-zero coordinate in a skipped block!\n");
          return 1;
        }
      }
      else {
        block[field] = 0;
      }
    }
  }
  else {
    local_269 = true;
    if (mb->mb_field_decoding_flag == 0) {
      local_269 = cabac->slice->field_pic_flag != 0;
    }
    significant_coeff_flag[0x3e] = (uint32_t)local_269;
    memset(last_significant_coeff_flag + 0x3e,0,0x100);
    memset(&numcoeff,0,0x100);
    if (str->dir == VS_ENCODE) {
      num1 = -1;
      for (field = 0; field < maxnumcoeff; field = field + 1) {
        if (block[field] == 0) {
          last_significant_coeff_flag[(long)field + 0x3e] = 0;
        }
        else {
          if ((field < start) || (end < field)) {
            fprintf(_stderr,"Non-zero coordinate outside start..end!\n");
            return 1;
          }
          last_significant_coeff_flag[(long)field + 0x3e] = 1;
          num1 = field;
        }
        (&numcoeff)[field] = 0;
      }
      if (num1 == -1) {
        __assert_fail("last != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/vstream/h264_residual.c"
                      ,0xce,
                      "int h264_residual_cabac(struct bitstream *, struct h264_cabac_context *, struct h264_slice *, struct h264_macroblock *, int32_t *, int, int, int, int, int, int)"
                     );
      }
      (&numcoeff)[num1] = 1;
    }
    numgt1 = end + 1;
    for (field = start; field < numgt1 + -1; field = field + 1) {
      iVar1 = h264_significant_coeff_flag
                        (str,cabac,significant_coeff_flag[0x3e],cat,field,0,
                         last_significant_coeff_flag + (long)field + 0x3e);
      if (iVar1 != 0) {
        return 1;
      }
      if (last_significant_coeff_flag[(long)field + 0x3e] != 0) {
        iVar1 = h264_significant_coeff_flag
                          (str,cabac,significant_coeff_flag[0x3e],cat,field,1,
                           (uint32_t *)(&numcoeff + field));
        if (iVar1 != 0) {
          return 1;
        }
        if ((&numcoeff)[field] != 0) {
          numgt1 = field + 1;
        }
      }
    }
    last_significant_coeff_flag[(long)(numgt1 + -1) + 0x3e] = 1;
    if (str->dir == VS_DECODE) {
      for (field = 0; field < maxnumcoeff; field = field + 1) {
        block[field] = 0;
      }
    }
    cam1 = 0;
    s = 0;
    field = numgt1;
    while (field = field + -1, start <= field) {
      if (last_significant_coeff_flag[(long)field + 0x3e] != 0) {
        local_25c = block[field];
        if (local_25c < 1) {
          local_25c = -local_25c;
        }
        local_25c = local_25c + -1;
        local_260 = (uint)(block[field] < 0);
        iVar1 = h264_coeff_abs_level_minus1(str,cabac,cat,cam1,s,&local_25c);
        if (iVar1 != 0) {
          return 1;
        }
        iVar1 = h264_cabac_bypass(str,cabac,&local_260);
        if (iVar1 != 0) {
          return 1;
        }
        if (local_25c == 0) {
          cam1 = cam1 + 1;
        }
        else {
          s = s + 1;
        }
        if (str->dir == VS_DECODE) {
          if (local_260 == 0) {
            local_270 = local_25c + 1;
          }
          else {
            local_270 = -(local_25c + 1);
          }
          block[field] = local_270;
        }
      }
    }
  }
  return 0;
}

Assistant:

int h264_residual_cabac(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb, int32_t *block, int cat, int idx, int start, int end, int maxnumcoeff, int coded) {
	int i;
	uint32_t coded_block_flag = 0;
	for (i = 0 ; i < maxnumcoeff; i++)
		if (block[i])
			coded_block_flag = 1;
	if (coded) {
		if (maxnumcoeff != 64 || slice->chroma_array_type == 3) {
			if (h264_coded_block_flag(str, cabac, cat, idx, &coded_block_flag)) return 1;
		} else {
			if (vs_infer(str, &coded_block_flag, 1)) return 1;
		}
	} else {
		if (vs_infer(str, &coded_block_flag, 0)) return 1;
	}
	switch (cat) {
		case H264_CTXBLOCKCAT_LUMA_DC:
			mb->coded_block_flag[0][16] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_LUMA_AC:
		case H264_CTXBLOCKCAT_LUMA_4X4:
			mb->coded_block_flag[0][idx] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_LUMA_8X8:
			mb->coded_block_flag[0][idx * 4 + 0] = coded_block_flag;
			mb->coded_block_flag[0][idx * 4 + 1] = coded_block_flag;
			mb->coded_block_flag[0][idx * 4 + 2] = coded_block_flag;
			mb->coded_block_flag[0][idx * 4 + 3] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CB_DC:
			mb->coded_block_flag[1][16] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CB_AC:
		case H264_CTXBLOCKCAT_CB_4X4:
			mb->coded_block_flag[1][idx] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CB_8X8:
			mb->coded_block_flag[1][idx * 4 + 0] = coded_block_flag;
			mb->coded_block_flag[1][idx * 4 + 1] = coded_block_flag;
			mb->coded_block_flag[1][idx * 4 + 2] = coded_block_flag;
			mb->coded_block_flag[1][idx * 4 + 3] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CR_DC:
			mb->coded_block_flag[2][16] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CR_AC:
		case H264_CTXBLOCKCAT_CR_4X4:
			mb->coded_block_flag[2][idx] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CR_8X8:
			mb->coded_block_flag[2][idx * 4 + 0] = coded_block_flag;
			mb->coded_block_flag[2][idx * 4 + 1] = coded_block_flag;
			mb->coded_block_flag[2][idx * 4 + 2] = coded_block_flag;
			mb->coded_block_flag[2][idx * 4 + 3] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CHROMA_DC:
			mb->coded_block_flag[idx+1][16] = coded_block_flag;
			break;
		case H264_CTXBLOCKCAT_CHROMA_AC:
			mb->coded_block_flag[(idx >> 3)+1][idx & 7] = coded_block_flag;
			break;
		default:
			abort();
	}
	if (coded_block_flag) {
		int field = mb->mb_field_decoding_flag || cabac->slice->field_pic_flag;
		uint32_t significant_coeff_flag[64] = { 0 };
		uint32_t last_significant_coeff_flag[64] = { 0 };
		if (str->dir == VS_ENCODE) {
			int last = -1;
			for (i = 0; i < maxnumcoeff; i++) {
				if (block[i]) {
					if (i < start || i > end) {
						fprintf (stderr, "Non-zero coordinate outside start..end!\n");
						return 1;
					}
					significant_coeff_flag[i] = 1;
					last = i;
				} else {
					significant_coeff_flag[i] = 0;
				}
				last_significant_coeff_flag[i] = 0;
			}
			assert(last != -1);
			last_significant_coeff_flag[last] = 1;
		}
		int numcoeff = end + 1;
		for (i = start; i < numcoeff - 1; i++) {
			if (h264_significant_coeff_flag(str, cabac, field, cat, i, 0, &significant_coeff_flag[i])) return 1;
			if (significant_coeff_flag[i]) {
				if (h264_significant_coeff_flag(str, cabac, field, cat, i, 1, &last_significant_coeff_flag[i])) return 1;
				if (last_significant_coeff_flag[i]) {
					numcoeff = i + 1;
				}
			}
		}
		significant_coeff_flag[numcoeff-1] = 1;
		if (str->dir == VS_DECODE) {
			for (i = 0; i < maxnumcoeff; i++)
				block[i] = 0;
		}
		int num1 = 0, numgt1 = 0;
		for (i = numcoeff - 1; i >= start; i--) {
			if (significant_coeff_flag[i]) {
				int32_t cam1 = abs(block[i]) - 1;
				uint32_t s = block[i] < 0;
				if (h264_coeff_abs_level_minus1(str, cabac, cat, num1, numgt1, &cam1)) return 1;
				if (h264_cabac_bypass(str, cabac, &s)) return 1;
				if (cam1)
					numgt1++;
				else
					num1++;
				if (str->dir == VS_DECODE)
					block[i] = (s ? -(cam1 + 1) : cam1 + 1);
			}
		}
	} else {
		for (i = 0; i < maxnumcoeff; i++) {
			if (str->dir == VS_ENCODE) {
				if (block[i]) {
					fprintf(stderr, "Non-zero coordinate in a skipped block!\n");
					return 1;
				}
			} else {
				block[i] = 0;
			}
		}
	}
	return 0;
}